

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall UnitTests::Assert::Equals<int,int>(Assert *this,int *expected,int *actual)

{
  string local_40 [32];
  int *local_20;
  int *actual_local;
  int *expected_local;
  Assert *this_local;
  
  local_20 = actual;
  actual_local = expected;
  expected_local = (int *)this;
  std::__cxx11::string::string(local_40);
  Equals<int,int>(this,(string *)local_40,actual_local,local_20);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Equals(const T& expected, const U& actual) const
        {
            Equals(std::string(), expected, actual);
        }